

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

AttributeSpecSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AttributeSpecSyntax,slang::syntax::AttributeSpecSyntax_const&>
          (BumpAllocator *this,AttributeSpecSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  EqualsValueClauseSyntax *pEVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  AttributeSpecSyntax *pAVar10;
  
  pAVar10 = (AttributeSpecSyntax *)allocate(this,0x30,8);
  uVar5 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar6 = (args->name).kind;
  uVar7 = (args->name).field_0x2;
  NVar8.raw = (args->name).numFlags.raw;
  uVar9 = (args->name).rawLen;
  pIVar3 = (args->name).info;
  pEVar4 = args->value;
  (pAVar10->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pAVar10->super_SyntaxNode).field_0x4 = uVar5;
  (pAVar10->super_SyntaxNode).parent = pSVar1;
  (pAVar10->super_SyntaxNode).previewNode = pSVar2;
  (pAVar10->name).kind = TVar6;
  (pAVar10->name).field_0x2 = uVar7;
  (pAVar10->name).numFlags = (NumericTokenFlags)NVar8.raw;
  (pAVar10->name).rawLen = uVar9;
  (pAVar10->name).info = pIVar3;
  pAVar10->value = pEVar4;
  return pAVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }